

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

char * Scl_LibertyReadDefaultWireLoadSel(Scl_Tree_t *p)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *pcVar3;
  int *piVar4;
  
  piVar4 = &p->pItems->Child;
  while( true ) {
    pSVar2 = Scl_LibertyItem(p,*piVar4);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return "";
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"default_wire_load_selection");
    if (iVar1 == 0) break;
    piVar4 = &pSVar2->Next;
  }
  pcVar3 = Scl_LibertyReadString(p,pSVar2->Head);
  return pcVar3;
}

Assistant:

char * Scl_LibertyReadDefaultWireLoadSel( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "default_wire_load_selection" )
        return Scl_LibertyReadString(p, pItem->Head);
    return "";
}